

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

int32_t __thiscall
sptk::reaper::EpochTracker::FindNccfPeaks
          (EpochTracker *this,vector<float,_std::allocator<float>_> *input,float thresh,
          vector<short,_std::allocator<short>_> *output)

{
  float fVar1;
  value_type vVar2;
  value_type vVar3;
  uint uVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  vector<short,_std::allocator<short>_> *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  float in_XMM0_Da;
  int16_t hold;
  float val;
  int16_t i;
  int16_t max_out_index;
  int16_t max_index;
  float max_val;
  uint32_t n_peaks;
  int32_t limit;
  float in_stack_ffffffffffffffc8;
  float fVar8;
  undefined2 in_stack_ffffffffffffffcc;
  short sVar9;
  short sVar10;
  short sVar11;
  float fVar12;
  uint uVar13;
  
  sVar5 = std::vector<float,_std::allocator<float>_>::size(in_RSI);
  uVar4 = (int)sVar5 - 1;
  uVar13 = 0;
  fVar12 = 0.0;
  sVar11 = 1;
  sVar10 = 0;
  std::vector<short,_std::allocator<short>_>::resize(in_RDX,(ulong)uVar4 << 0x20);
  for (sVar9 = 1; (int)sVar9 < (int)uVar4; sVar9 = sVar9 + 1) {
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)sVar9);
    fVar1 = *pvVar6;
    in_stack_ffffffffffffffc8 = fVar1;
    if (((in_XMM0_Da < fVar1) &&
        (fVar8 = fVar1,
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)(sVar9 + -1)),
        in_stack_ffffffffffffffc8 = fVar8, *pvVar6 <= fVar1 && fVar1 != *pvVar6)) &&
       (pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)(sVar9 + 1)),
       *pvVar6 <= fVar8)) {
      if (fVar12 < in_stack_ffffffffffffffc8) {
        sVar10 = (short)uVar13;
        sVar11 = sVar9;
        fVar12 = in_stack_ffffffffffffffc8;
      }
      uVar13 = uVar13 + 1;
      std::vector<short,_std::allocator<short>_>::push_back
                ((vector<short,_std::allocator<short>_> *)CONCAT44(fVar12,CONCAT22(sVar11,sVar10)),
                 (value_type_conflict1 *)
                 CONCAT26(sVar9,CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)));
    }
  }
  if ((uVar13 < 2) || (sVar10 < 1)) {
    if (uVar13 == 0) {
      uVar13 = 1;
      std::vector<short,_std::allocator<short>_>::push_back
                ((vector<short,_std::allocator<short>_> *)CONCAT44(fVar12,CONCAT22(sVar11,sVar10)),
                 (value_type_conflict1 *)
                 CONCAT26(sVar9,CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)));
    }
  }
  else {
    pvVar7 = std::vector<short,_std::allocator<short>_>::operator[](in_RDX,0);
    vVar2 = *pvVar7;
    pvVar7 = std::vector<short,_std::allocator<short>_>::operator[](in_RDX,(long)sVar10);
    vVar3 = *pvVar7;
    pvVar7 = std::vector<short,_std::allocator<short>_>::operator[](in_RDX,0);
    *pvVar7 = vVar3;
    pvVar7 = std::vector<short,_std::allocator<short>_>::operator[](in_RDX,(long)sVar10);
    *pvVar7 = vVar2;
  }
  return uVar13;
}

Assistant:

int32_t EpochTracker::FindNccfPeaks(const std::vector<float>& input, float thresh,
                                    std::vector<int16_t>* output) {
  int32_t limit = input.size() - 1;
  uint32_t n_peaks = 0;
  float max_val = 0.0;
  int16_t max_index = 1;
  int16_t max_out_index = 0;
  output->resize(0);
  for (int16_t i = 1; i < limit; ++i) {
    float val = input[i];
    if ((val > thresh) && (val > input[i-1]) && (val >= input[i+1])) {
      if (val > max_val) {
        max_val = val;
        max_out_index = n_peaks;
        max_index = i;
      }
      n_peaks++;
      output->push_back(i);
    }
  }
  //  Be sure the highest peak is the first one in the array.
  if ((n_peaks > 1) && (max_out_index > 0)) {
    int16_t hold = (*output)[0];
    (*output)[0] = (*output)[max_out_index];
    (*output)[max_out_index] = hold;
  } else {
    if (n_peaks <= 0) {
      n_peaks = 1;
      output->push_back(max_index);
    }
  }
  return n_peaks;
}